

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_split.c
# Opt level: O3

REF_STATUS
ref_split_face(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  REF_CELL pRVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined8 uVar9;
  char *pcVar10;
  REF_INT new_cell;
  REF_INT cell;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT nodes [27];
  REF_INT face_nodes [27];
  REF_INT local_130;
  REF_INT local_12c;
  REF_INT local_128;
  int local_124;
  int local_120;
  int local_11c;
  REF_INT local_118 [28];
  REF_INT local_a8;
  REF_INT local_a4;
  REF_INT local_a0;
  REF_INT local_9c;
  
  pRVar1 = ref_grid->cell[8];
  local_124 = new_node;
  local_a8 = node0;
  local_a4 = node1;
  local_a0 = node2;
  local_9c = node0;
  uVar3 = ref_cell_with_face(pRVar1,&local_a8,&local_11c,&local_120);
  iVar2 = local_124;
  if (uVar3 != 0) {
    pcVar10 = "get tet(2)";
    uVar9 = 0x1e4;
    goto LAB_001d1ed2;
  }
  local_12c = node1;
  if (local_11c != -1) {
    local_128 = local_11c;
    uVar3 = ref_cell_nodes(pRVar1,local_11c,local_118);
    if (uVar3 != 0) {
      pcVar10 = "cell nodes";
      uVar9 = 0x1e7;
      goto LAB_001d1ed2;
    }
    uVar3 = ref_cell_remove(pRVar1,local_128);
    if (uVar3 != 0) {
      pcVar10 = "remove";
      uVar9 = 0x1e8;
      goto LAB_001d1ed2;
    }
    iVar5 = pRVar1->node_per;
    if (0 < (long)iVar5) {
      uVar6 = 0;
      do {
        if (local_118[uVar6] == node0) {
          local_118[uVar6] = iVar2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(long)iVar5);
    }
    uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
    if (uVar3 != 0) {
      pcVar10 = "add node0 version";
      uVar9 = 0x1ec;
      goto LAB_001d1ed2;
    }
    iVar5 = pRVar1->node_per;
    uVar6 = (ulong)iVar5;
    if (0 < (long)uVar6) {
      uVar7 = 0;
      do {
        if (local_118[uVar7] == iVar2) {
          local_118[uVar7] = node0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
      if (0 < iVar5) {
        uVar7 = 0;
        do {
          if (local_118[uVar7] == local_12c) {
            local_118[uVar7] = iVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar6);
      }
    }
    uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
    if (uVar3 != 0) {
      pcVar10 = "add node1 version";
      uVar9 = 0x1f2;
      goto LAB_001d1ed2;
    }
    iVar5 = pRVar1->node_per;
    uVar6 = (ulong)iVar5;
    if (0 < (long)uVar6) {
      uVar7 = 0;
      do {
        if (local_118[uVar7] == iVar2) {
          local_118[uVar7] = local_12c;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
      if (0 < iVar5) {
        uVar7 = 0;
        do {
          if (local_118[uVar7] == node2) {
            local_118[uVar7] = iVar2;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < uVar6);
      }
    }
    uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
    if (uVar3 != 0) {
      pcVar10 = "add node2 version";
      uVar9 = 0x1f8;
      goto LAB_001d1ed2;
    }
    iVar5 = pRVar1->node_per;
    if (0 < (long)iVar5) {
      uVar6 = 0;
      do {
        if (local_118[uVar6] == iVar2) {
          local_118[uVar6] = node2;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 < (ulong)(long)iVar5);
    }
  }
  if (local_120 != -1) {
    local_128 = local_120;
    uVar3 = ref_cell_nodes(pRVar1,local_120,local_118);
    if (uVar3 == 0) {
      uVar3 = ref_cell_remove(pRVar1,local_128);
      if (uVar3 == 0) {
        iVar5 = pRVar1->node_per;
        if (0 < (long)iVar5) {
          uVar6 = 0;
          do {
            if (local_118[uVar6] == node0) {
              local_118[uVar6] = iVar2;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)(long)iVar5);
        }
        uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
        if (uVar3 == 0) {
          iVar5 = pRVar1->node_per;
          uVar6 = (ulong)iVar5;
          if (0 < (long)uVar6) {
            uVar7 = 0;
            do {
              if (local_118[uVar7] == iVar2) {
                local_118[uVar7] = node0;
              }
              uVar7 = uVar7 + 1;
            } while (uVar7 < uVar6);
            if (0 < iVar5) {
              uVar7 = 0;
              do {
                if (local_118[uVar7] == local_12c) {
                  local_118[uVar7] = iVar2;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar6);
            }
          }
          uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
          if (uVar3 == 0) {
            iVar5 = pRVar1->node_per;
            uVar6 = (ulong)iVar5;
            if (0 < (long)uVar6) {
              uVar7 = 0;
              do {
                if (local_118[uVar7] == iVar2) {
                  local_118[uVar7] = local_12c;
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < uVar6);
              if (0 < iVar5) {
                uVar7 = 0;
                do {
                  if (local_118[uVar7] == node2) {
                    local_118[uVar7] = iVar2;
                  }
                  uVar7 = uVar7 + 1;
                } while (uVar7 < uVar6);
              }
            }
            uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
            if (uVar3 == 0) {
              iVar5 = pRVar1->node_per;
              if (0 < (long)iVar5) {
                uVar6 = 0;
                do {
                  if (local_118[uVar6] == iVar2) {
                    local_118[uVar6] = node2;
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 < (ulong)(long)iVar5);
              }
              goto LAB_001d22f6;
            }
            pcVar10 = "add node2 version";
            uVar9 = 0x20f;
          }
          else {
            pcVar10 = "add node1 version";
            uVar9 = 0x209;
          }
        }
        else {
          pcVar10 = "add node0 version";
          uVar9 = 0x203;
        }
      }
      else {
        pcVar10 = "remove";
        uVar9 = 0x1ff;
      }
    }
    else {
      pcVar10 = "cell nodes";
      uVar9 = 0x1fe;
    }
LAB_001d1ed2:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar9,
           "ref_split_face",(ulong)uVar3,pcVar10);
    return uVar3;
  }
LAB_001d22f6:
  pRVar1 = ref_grid->cell[3];
  uVar4 = ref_cell_with(pRVar1,&local_a8,&local_128);
  uVar3 = 0;
  if ((uVar4 != 0) && (uVar4 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",0x215,
           "ref_split_face",(ulong)uVar4,"find tri");
    uVar3 = uVar4;
  }
  if ((uVar4 != 5) && (uVar4 != 0)) {
    return uVar3;
  }
  if (local_128 == -1) {
    return 0;
  }
  uVar3 = ref_cell_nodes(pRVar1,local_128,local_118);
  if (uVar3 == 0) {
    uVar3 = ref_cell_remove(pRVar1,local_128);
    if (uVar3 == 0) {
      iVar5 = pRVar1->node_per;
      if (0 < iVar5) {
        lVar8 = 0;
        do {
          if (local_118[lVar8] == node0) {
            local_118[lVar8] = iVar2;
            iVar5 = pRVar1->node_per;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar5);
      }
      uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
      if (uVar3 == 0) {
        iVar5 = pRVar1->node_per;
        if (0 < iVar5) {
          lVar8 = 0;
          do {
            if (local_118[lVar8] == iVar2) {
              local_118[lVar8] = node0;
              iVar5 = pRVar1->node_per;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < iVar5);
          if (0 < iVar5) {
            lVar8 = 0;
            do {
              if (local_118[lVar8] == local_12c) {
                local_118[lVar8] = iVar2;
                iVar5 = pRVar1->node_per;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar5);
          }
        }
        uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
        if (uVar3 == 0) {
          iVar5 = pRVar1->node_per;
          if (0 < iVar5) {
            lVar8 = 0;
            do {
              if (local_118[lVar8] == iVar2) {
                local_118[lVar8] = local_12c;
                iVar5 = pRVar1->node_per;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar5);
            if (0 < iVar5) {
              lVar8 = 0;
              do {
                if (local_118[lVar8] == node2) {
                  local_118[lVar8] = iVar2;
                  iVar5 = pRVar1->node_per;
                }
                lVar8 = lVar8 + 1;
              } while (lVar8 < iVar5);
            }
          }
          uVar3 = ref_cell_add(pRVar1,local_118,&local_130);
          if (uVar3 == 0) {
            iVar5 = pRVar1->node_per;
            if (iVar5 < 1) {
              return 0;
            }
            lVar8 = 0;
            do {
              if (local_118[lVar8] == iVar2) {
                local_118[lVar8] = node2;
                iVar5 = pRVar1->node_per;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar5);
            return 0;
          }
          pcVar10 = "add node2 version";
          uVar9 = 0x228;
        }
        else {
          pcVar10 = "add node1 version";
          uVar9 = 0x222;
        }
      }
      else {
        pcVar10 = "add node0 version";
        uVar9 = 0x21c;
      }
    }
    else {
      pcVar10 = "remove";
      uVar9 = 0x218;
    }
  }
  else {
    pcVar10 = "cell nodes";
    uVar9 = 0x217;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_split.c",uVar9,
         "ref_split_face",(ulong)uVar3,pcVar10);
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_split_face(REF_GRID ref_grid, REF_INT node0,
                                  REF_INT node1, REF_INT node2,
                                  REF_INT new_node) {
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], face_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT cell0, cell1;
  REF_INT node, new_cell;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  ref_cell = ref_grid_tet(ref_grid);
  RSS(ref_cell_with_face(ref_cell, face_nodes, &cell0, &cell1), "get tet(2)");
  if (REF_EMPTY != cell0) {
    cell = cell0;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }
  if (REF_EMPTY != cell1) {
    cell = cell1;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  ref_cell = ref_grid_tri(ref_grid);
  RXS(ref_cell_with(ref_cell, face_nodes, &cell), REF_NOT_FOUND, "find tri");
  if (REF_EMPTY != cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    RSS(ref_cell_remove(ref_cell, cell), "remove");

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node0 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node0 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node0;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node1 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node1;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node2 == nodes[node]) nodes[node] = new_node;
    RSS(ref_cell_add(ref_cell, nodes, &new_cell), "add node2 version");
    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (new_node == nodes[node]) nodes[node] = node2;
  }

  return REF_SUCCESS;
}